

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
::
Heap_column<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<int,std::allocator<int>>>
          (Heap_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
           *this,Index columnIndex,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices,Dimension dimension
          ,vector<int,_std::allocator<int>_> *rowContainer,Column_settings *colSettings)

{
  pointer puVar1;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  pointer puVar5;
  allocator_type local_41;
  Heap_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
  *local_40;
  value_type local_38;
  
  *(Dimension *)this = dimension;
  puVar5 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start;
  puVar1 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 == puVar1) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = puVar1[-1];
  }
  *(uint *)(this + 4) = uVar3;
  *(undefined4 *)(this + 8) = 0xffffffff;
  local_38 = (value_type)0x0;
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
  ::vector((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
            *)(this + 0x10),(long)puVar1 - (long)puVar5 >> 2,&local_38,&local_41);
  *(undefined4 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(Column_settings **)(this + 0x38) = colSettings;
  puVar1 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  local_40 = this;
  for (puVar5 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    uVar3 = *puVar5;
    puVar2 = (uint *)operator_new(4);
    *puVar2 = uVar3;
    *(uint **)(*(long *)(this + 0x10) + uVar4 * 8) = puVar2;
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  std::
  make_heap<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>>,Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>::EntryPointerComp>
            (*(undefined8 *)(local_40 + 0x10),*(undefined8 *)(local_40 + 0x18));
  return;
}

Assistant:

inline Heap_column<Master_matrix>::Heap_column(Index columnIndex,
                                               const Container& nonZeroRowIndices,
                                               Dimension dimension,
                                               Row_container* rowContainer,
                                               Column_settings* colSettings)
    : Dim_opt(dimension),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      column_(nonZeroRowIndices.size(), nullptr),
      insertsSinceLastPrune_(0),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  Index i = 0;
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      column_[i++] = entryPool_->construct(id);
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      column_[i] = entryPool_->construct(p.first);
      column_[i++]->set_element(operators_->get_value(p.second));
    }
  }
  std::make_heap(column_.begin(), column_.end(), entryPointerComp_);
}